

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Answer * __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::erase
          (Answer *__return_storage_ptr__,
          ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *this,
          uint id)

{
  byte bVar1;
  uint id_local;
  undefined1 local_78 [32];
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_58;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext_&> local_48;
  uint *puStack_40;
  ArrayDisposer *local_38;
  
  if (id < 0x10) {
    RpcSystemBase::RpcConnectionState::Answer::Answer(__return_storage_ptr__,this->low + id);
    local_48.ptr = (RpcCallContext *)0x0;
    puStack_40 = (uint *)0x0;
    local_58._0_8_ = 0;
    local_58._8_8_ = (RpcCallContext *)0x0;
    local_78._16_8_ = (PipelineHook *)0x0;
    local_78._24_8_ = 0;
    local_78._0_8_ = (Disposer *)0x0;
    local_78._8_8_ = (Disposer *)0x0;
    local_38 = (ArrayDisposer *)0x0;
    RpcSystemBase::RpcConnectionState::Answer::operator=(this->low + id,(Answer *)local_78);
    RpcSystemBase::RpcConnectionState::Answer::~Answer((Answer *)local_78);
    bVar1 = (byte)id & 0x1f;
    this->presenceBits = this->presenceBits & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  }
  else {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>>
                *)local_78,(uint *)&this->high);
    if ((Entry *)local_78._0_8_ == (Entry *)0x0) {
      (__return_storage_ptr__->resultExports).ptr = (uint *)0x0;
      (__return_storage_ptr__->resultExports).size_ = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->task).field_1 + 8) = 0;
      (__return_storage_ptr__->callContext).ptr = (RpcCallContext *)0x0;
      *(undefined8 *)&__return_storage_ptr__->task = 0;
      *(undefined8 *)&(__return_storage_ptr__->task).field_1 = 0;
      (__return_storage_ptr__->pipeline).ptr.disposer = (Disposer *)0x0;
      (__return_storage_ptr__->pipeline).ptr.ptr = (PipelineHook *)0x0;
      (__return_storage_ptr__->resultExports).disposer = (ArrayDisposer *)0x0;
    }
    else {
      kj::
      Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
      ::release((Entry *)local_78,&(this->high).table,(Entry *)local_78._0_8_);
      RpcSystemBase::RpcConnectionState::Answer::Answer
                (__return_storage_ptr__,(Answer *)(local_78 + 8));
      RpcSystemBase::RpcConnectionState::Answer::~Answer((Answer *)(local_78 + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    if (id < kj::size(low)) {
      T toRelease = kj::mv(low[id]);
      low[id] = T();
      presenceBits &= ~(1 << id);
      return toRelease;
    } else {
      KJ_IF_SOME(entry, high.findEntry(id)) {
        return high.release(entry).value;
      } else {
        return {};
      }
    }